

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O3

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  __int32_t **pp_Var4;
  size_t sVar5;
  int extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined8 *in_R8;
  long *in_R9;
  char cVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  
  if ((token != (char *)0x0) && (pcVar9 = *subj, pcVar9 != (char *)0x0)) {
    cVar6 = *token;
    if (case_insensitive == 0) {
      if (cVar6 != '\0') {
        pcVar8 = token + 1;
        do {
          if (cVar6 != *pcVar9) {
            return 0;
          }
          pcVar9 = pcVar9 + 1;
          cVar6 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar6 != '\0');
      }
    }
    else if (cVar6 != '\0') {
      pcVar8 = token + 1;
      do {
        cVar1 = *pcVar9;
        if ((long)cVar1 == 0) {
          return 0;
        }
        pp_Var4 = __ctype_tolower_loc();
        if ((*pp_Var4)[cVar6] != (*pp_Var4)[cVar1]) {
          return 0;
        }
        pcVar9 = pcVar9 + 1;
        cVar6 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar6 != '\0');
    }
    *subj = pcVar9;
    return 1;
  }
  nn_ws_match_token_cold_1();
  if ((token == (char *)0x0) || (pcVar9 = *subj, pcVar9 == (char *)0x0)) {
    nn_ws_match_value_cold_1();
    sVar5 = strlen(token);
    if (sVar5 == CONCAT44(extraout_var,extraout_EDX_00)) {
      cVar6 = *token;
      iVar3 = 1;
      if (cVar6 != '\0') {
        lVar7 = 0;
        do {
          cVar1 = *(char *)((long)subj + lVar7);
          if ((long)cVar1 == 0) {
            return 1;
          }
          pp_Var4 = __ctype_tolower_loc();
          if ((*pp_Var4)[cVar6] != (*pp_Var4)[cVar1]) goto LAB_001313b7;
          cVar6 = token[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (cVar6 != '\0');
      }
    }
    else {
LAB_001313b7:
      iVar3 = 0;
    }
    return iVar3;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (long *)0x0) {
    *in_R9 = 0;
  }
  pcVar8 = strstr(pcVar9,token);
  if (pcVar8 == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    sVar5 = strlen(token);
    *subj = pcVar8 + sVar5;
    pcVar2 = pcVar9;
    if (extraout_EDX != 0) {
      do {
        pcVar9 = pcVar2;
        if (pcVar8 <= pcVar9) break;
        pcVar2 = pcVar9 + 1;
      } while (*pcVar9 == ' ');
    }
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = pcVar9;
    }
    iVar3 = 1;
    if (pcVar9 != pcVar8) {
      pcVar2 = pcVar8;
      if (ignore_leading_sp != 0) {
        do {
          pcVar8 = pcVar2;
          if (pcVar8 <= pcVar9) break;
          pcVar2 = pcVar8 + -1;
        } while (pcVar8[-1] == ' ');
      }
      if (in_R9 != (long *)0x0) {
        *in_R9 = (long)pcVar8 - (long)pcVar9;
      }
    }
  }
  return iVar3;
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}